

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  element_type *peVar1;
  shared_ptr<Body> *body_00;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  shared_ptr<Body> *body;
  pointer body_01;
  pointer psVar6;
  double dVar7;
  undefined1 local_99;
  shared_ptr<Quad> quad;
  shared_ptr<BHTree> tree;
  vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> bodies;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double radius;
  
  radius = 250000000000.0;
  bodies.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bodies.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bodies.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_60 = 0.0;
  local_50 = 0.0;
  local_40 = 0.0;
  local_48 = 4.9725e+41;
  quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Body,std::allocator<Body>,double,double,double,double,double>
            (&quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(Body **)&quad,
             (allocator<Body> *)&local_99,(double *)&tree,&local_60,&local_50,&local_40,&local_48);
  std::vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>>::
  emplace_back<std::shared_ptr<Body>>
            ((vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>> *)&bodies,
             (shared_ptr<Body> *)&quad);
  if (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x422af637c6000000;
  local_60 = 0.0;
  local_50 = 0.0;
  local_40 = 23950000000.0;
  local_48 = 8.255e+34;
  quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Body,std::allocator<Body>,double,double,double,double,double>
            (&quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(Body **)&quad,
             (allocator<Body> *)&local_99,(double *)&tree,&local_60,&local_50,&local_40,&local_48);
  std::vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>>::
  emplace_back<std::shared_ptr<Body>>
            ((vector<std::shared_ptr<Body>,std::allocator<std::shared_ptr<Body>>> *)&bodies,
             (shared_ptr<Body> *)&quad);
  if (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  dVar7 = 0.0;
  do {
    tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
         0xffffffff00000000);
    local_60 = (double)((ulong)local_60 & 0xffffffff00000000);
    quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_58 = dVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Quad,std::allocator<Quad>,int,int,double&>
              (&quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(Quad **)&quad
               ,(allocator<Quad> *)&local_50,(int *)&tree,(int *)&local_60,&radius);
    tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<BHTree,std::allocator<BHTree>,std::shared_ptr<Quad>&>
              (&tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (BHTree **)&tree,(allocator<BHTree> *)&local_60,&quad);
    psVar3 = bodies.
             super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    body_01 = bodies.
              super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (bodies.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        bodies.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar5 = Body::in((body_01->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                         &quad);
        if (bVar5) {
          BHTree::insert(tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,body_01)
          ;
        }
        psVar4 = bodies.
                 super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        body_01 = body_01 + 1;
        body_00 = bodies.
                  super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar6 = bodies.
                 super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        psVar2 = bodies.
                 super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      } while (body_01 != psVar3);
      for (; bodies.
             super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
             _M_impl.super__Vector_impl_data._M_start = psVar6,
          bodies.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = psVar2, body_00 != psVar4;
          body_00 = body_00 + 1) {
        Body::resetForce((body_00->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        BHTree::updateForce(tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            body_00);
        Body::update((body_00->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0.1);
        psVar6 = bodies.
                 super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        psVar2 = bodies.
                 super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; psVar6 != psVar2; psVar6 = psVar6 + 1) {
        peVar1 = (psVar6->super___shared_ptr<Body,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        printf("%10.3E %10.3E %10.3E %10.3E\n",peVar1->x,peVar1->y,peVar1->vx,peVar1->vy);
      }
    }
    puts("======");
    if (tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    dVar7 = local_58 + 0.1;
  } while (dVar7 < 0.5);
  std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::~vector(&bodies);
  return 0;
}

Assistant:

int main() {
    double dt = 0.1;
    double radius = 2.5E11;

    std::vector<std::shared_ptr<Body>> bodies;
    bodies.push_back(std::make_shared<Body>(0.0, 0.0, 0.0, 0.0, 4.97250E41));
    bodies.push_back(std::make_shared<Body>(5.790E10, 0.0, 0.0, 2.395E10, 8.25500E34));


    for (double t = 0; t < 0.5; t += dt) {
        std::shared_ptr<Quad> quad = std::make_shared<Quad>(0, 0, radius);
        std::shared_ptr<BHTree> tree = std::make_shared<BHTree>(quad);

        for (const auto &body : bodies) {
            if (body->in(quad)) {
                tree->insert(body);
            }
        }

        for (const auto &body : bodies) {
            body->resetForce();
            tree->updateForce(body);
            body->update(dt);
        }

        for (const auto &body : bodies) {
            printf("%10.3E %10.3E %10.3E %10.3E\n", body->x, body->y, body->vx, body->vy);
        }

        printf("======\n");
    }
    return 0;
}